

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_language(void)

{
  char cVar1;
  XSValue *pXVar2;
  long lVar3;
  int iVar4;
  void *pvVar5;
  char *pcVar6;
  char *pcVar7;
  Status myStatus;
  char v_2 [3];
  char iv_3 [6];
  char iv_2 [6];
  char iv_1 [6];
  char v_3 [6];
  char v_1 [6];
  Status local_74;
  StrX local_70;
  char local_5c [4];
  char local_58 [8];
  char local_50 [8];
  char local_48 [8];
  char local_40 [8];
  char local_38 [8];
  
  builtin_strncpy(local_38,"en-AT",6);
  local_5c[2] = 0;
  local_5c[0] = 'j';
  local_5c[1] = 'a';
  builtin_strncpy(local_40,"uk-GB",6);
  builtin_strncpy(local_48,"ja_JP",6);
  builtin_strncpy(local_50,"en+US",6);
  builtin_strncpy(local_58,"12-en",6);
  local_74 = st_Init;
  local_70.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_70.fUnicodeForm,dt_language,&local_74,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_70);
  if (cVar1 == '\0') {
    StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x15b3,local_38,local_70.fLocalForm,1);
    StrX::~StrX(&local_70);
    errSeen = 1;
  }
  local_74 = st_Init;
  local_70.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_5c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_5c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_70.fUnicodeForm,dt_language,&local_74,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_70);
  if (cVar1 == '\0') {
    StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x15b4,local_5c,local_70.fLocalForm,1);
    StrX::~StrX(&local_70);
    errSeen = 1;
  }
  local_74 = st_Init;
  local_70.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_70.fUnicodeForm,dt_language,&local_74,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_70);
  if (cVar1 == '\0') {
    StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x15b5,local_40,local_70.fLocalForm,1);
    StrX::~StrX(&local_70);
    errSeen = 1;
  }
  local_74 = st_Init;
  local_70.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_70.fUnicodeForm,dt_language,&local_74,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_70);
  if (cVar1 != '\0') {
    StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x15b8,local_48,local_70.fLocalForm,0);
    StrX::~StrX(&local_70);
    errSeen = 1;
  }
  local_74 = st_Init;
  local_70.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_70.fUnicodeForm,dt_language,&local_74,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_70);
  if (cVar1 != '\0') {
    StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x15b9,local_50,local_70.fLocalForm,0);
    StrX::~StrX(&local_70);
    errSeen = 1;
  }
  local_74 = st_Init;
  local_70.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_70.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_70.fUnicodeForm,dt_language,&local_74,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_70);
  if (cVar1 != '\0') {
    StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x15ba,local_58,local_70.fLocalForm,0);
    StrX::~StrX(&local_70);
    errSeen = 1;
  }
  iVar4 = 1;
  do {
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_70.fUnicodeForm,dt_language,&local_74,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (pXVar2 == (XSValue *)0x0) {
      if (local_74 != st_NoActVal) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x15d4,local_38,local_70.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_70);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
      pvVar5 = (void *)0x15d4;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15d4,local_38);
      StrX::~StrX(&local_70);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_5c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_5c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_70.fUnicodeForm,dt_language,&local_74,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (pXVar2 == (XSValue *)0x0) {
      if (local_74 != st_NoActVal) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x15d5,local_5c,local_70.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_70);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
      pvVar5 = (void *)0x15d5;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15d5,local_5c);
      StrX::~StrX(&local_70);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_70.fUnicodeForm,dt_language,&local_74,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (pXVar2 == (XSValue *)0x0) {
      if (local_74 != st_NoActVal) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x15d6,local_40,local_70.fLocalForm,"st_NoActVal",pcVar6);
        StrX::~StrX(&local_70);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
      pvVar5 = (void *)0x15d6;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15d6,local_40);
      StrX::~StrX(&local_70);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_70.fUnicodeForm,dt_language,&local_74,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (pXVar2 == (XSValue *)0x0) {
      if ((uint)(iVar4 == 1) * 3 + st_NoActVal != local_74) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
        pcVar6 = "st_NoActVal";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x15da,local_48,local_70.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_70);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
      pvVar5 = (void *)0x15da;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15da,local_48);
      StrX::~StrX(&local_70);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_70.fUnicodeForm,dt_language,&local_74,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (pXVar2 == (XSValue *)0x0) {
      if ((uint)(iVar4 == 1) * 3 + st_NoActVal != local_74) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
        pcVar6 = "st_NoActVal";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x15dc,local_50,local_70.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_70);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
      pvVar5 = (void *)0x15dc;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15dc,local_50);
      StrX::~StrX(&local_70);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar2 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_70.fUnicodeForm,dt_language,&local_74,ver_10,iVar4 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (pXVar2 == (XSValue *)0x0) {
      if ((uint)(iVar4 == 1) * 3 + st_NoActVal != local_74) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
        pcVar6 = "st_NoActVal";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x15de,local_58,local_70.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_70);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
      pvVar5 = (void *)0x15de;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15de,local_58);
      StrX::~StrX(&local_70);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar2);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar2,pvVar5);
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 == 0);
  iVar4 = 1;
  do {
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_70.fUnicodeForm,dt_language,&local_74,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (lVar3 == 0) {
      if (local_74 != st_NoCanRep) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x15fb,local_38,local_70.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_70);
        goto LAB_0013366f;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15fb,local_38);
      StrX::~StrX(&local_70);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_0013366f:
      errSeen = 1;
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_5c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_5c,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_70.fUnicodeForm,dt_language,&local_74,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (lVar3 == 0) {
      if (local_74 != st_NoCanRep) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x15fc,local_5c,local_70.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_70);
        goto LAB_0013377c;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15fc,local_5c);
      StrX::~StrX(&local_70);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_0013377c:
      errSeen = 1;
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_70.fUnicodeForm,dt_language,&local_74,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (lVar3 == 0) {
      if (local_74 != st_NoCanRep) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
        pcVar6 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar6 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x15fd,local_40,local_70.fLocalForm,"st_NoCanRep",pcVar6);
        StrX::~StrX(&local_70);
        goto LAB_00133886;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15fd,local_40);
      StrX::~StrX(&local_70);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_00133886:
      errSeen = 1;
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_48,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_70.fUnicodeForm,dt_language,&local_74,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (lVar3 == 0) {
      if ((uint)(iVar4 == 1) * 4 + st_NoCanRep != local_74) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
        pcVar6 = "st_NoCanRep";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1601,local_48,local_70.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_70);
        goto LAB_001339ac;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1601,local_48);
      StrX::~StrX(&local_70);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_001339ac:
      errSeen = 1;
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_50,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_70.fUnicodeForm,dt_language,&local_74,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (lVar3 == 0) {
      if ((uint)(iVar4 == 1) * 4 + st_NoCanRep != local_74) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
        pcVar6 = "st_NoCanRep";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1603,local_50,local_70.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_70);
        goto LAB_00133ad2;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1603,local_50);
      StrX::~StrX(&local_70);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_00133ad2:
      errSeen = 1;
    }
    local_74 = st_Init;
    local_70.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_70.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_58,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar3 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_70.fUnicodeForm,dt_language,&local_74,ver_10,iVar4 == 1,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_70);
    if (lVar3 == 0) {
      if ((uint)(iVar4 == 1) * 4 + st_NoCanRep != local_74) {
        StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
        pcVar6 = "st_NoCanRep";
        if (iVar4 == 1) {
          pcVar6 = "st_FOCA0002";
        }
        pcVar7 = "st_UnknownType";
        if ((ulong)local_74 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00142bc8)[local_74];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1605,local_58,local_70.fLocalForm,pcVar6,pcVar7);
        StrX::~StrX(&local_70);
        goto LAB_00133bf8;
      }
    }
    else {
      StrX::StrX(&local_70,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1605,local_58);
      StrX::~StrX(&local_70);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar3);
LAB_00133bf8:
      errSeen = 1;
    }
    iVar4 = iVar4 + -1;
    if (iVar4 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_language()
{
    const XSValue::DataType dt = XSValue::dt_language;
    bool  toValidate = true;

    const char v_1[]="en-AT";
    const char v_2[]="ja";
    const char v_3[]="uk-GB";

    const char iv_1[]="ja_JP";
    const char iv_2[]="en+US";
    const char iv_3[]="12-en";

    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_3;  act_v_ran_v_3.fValue.f_strVal = 0;
    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                      n/a            false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_2,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_3,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_NoActVal
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_2,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_3,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));

    }

}